

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void luaX_setinput(lua_State *L,LexState *ls,ZIO *z,TString *source)

{
  size_t sVar1;
  byte *pbVar2;
  char *pcVar3;
  uint local_2c;
  TString *source_local;
  ZIO *z_local;
  LexState *ls_local;
  lua_State *L_local;
  
  ls->decpoint = '.';
  ls->L = L;
  (ls->lookahead).token = 0x11f;
  ls->z = z;
  ls->fs = (FuncState *)0x0;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->source = source;
  pcVar3 = (char *)luaM_realloc_(ls->L,ls->buff->buffer,ls->buff->buffsize,0x20);
  ls->buff->buffer = pcVar3;
  ls->buff->buffsize = 0x20;
  sVar1 = ls->z->n;
  ls->z->n = sVar1 - 1;
  if (sVar1 == 0) {
    local_2c = luaZ_fill(ls->z);
  }
  else {
    pbVar2 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar2 + 1);
    local_2c = (uint)*pbVar2;
  }
  ls->current = local_2c;
  return;
}

Assistant:

void luaX_setinput (lua_State *L, LexState *ls, ZIO *z, TString *source) {
  ls->decpoint = '.';
  ls->L = L;
  ls->lookahead.token = TK_EOS;  /* no look-ahead token */
  ls->z = z;
  ls->fs = NULL;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->source = source;
  luaZ_resizebuffer(ls->L, ls->buff, LUA_MINBUFFER);  /* initialize buffer */
  next(ls);  /* read first char */
}